

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void restore_stack_limit(lua_State *L)

{
  CallInfo *block;
  CallInfo *pCVar1;
  CallInfo *oldci;
  
  if ((20000 < (long)L->size_ci) &&
     (block = L->base_ci, (int)((ulong)((long)L->ci - (long)block) >> 3) * -0x33333333 < 19999)) {
    pCVar1 = (CallInfo *)luaM_realloc_(L,block,(long)L->size_ci * 0x28,800000);
    L->base_ci = pCVar1;
    L->size_ci = 20000;
    L->ci = (CallInfo *)(((long)L->ci - (long)block) + (long)pCVar1);
    L->end_ci = pCVar1 + 19999;
  }
  return;
}

Assistant:

static void restore_stack_limit(lua_State*L){
if(L->size_ci>20000){
int inuse=cast_int(L->ci-L->base_ci);
if(inuse+1<20000)
luaD_reallocCI(L,20000);
}
}